

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-backend-ops.cpp
# Opt level: O0

ggml_tensor * __thiscall test_rms_norm_back::build_graph(test_rms_norm_back *this,ggml_context *ctx)

{
  ggml_tensor *pgVar1;
  ggml_tensor *pgVar2;
  undefined8 in_RSI;
  test_case *in_RDI;
  ggml_tensor *out;
  ggml_tensor *b;
  ggml_tensor *a;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 uVar3;
  undefined8 in_stack_ffffffffffffffc0;
  undefined8 uVar4;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  undefined4 uVar5;
  
  uVar3 = *(undefined4 *)&in_RDI[1]._vptr_test_case;
  std::array<long,_4UL>::data((array<long,_4UL> *)0x150d52);
  pgVar1 = test_case::ggml_new_tensor
                     (in_RDI,(ggml_context *)
                             CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                      (ggml_type)((ulong)in_stack_ffffffffffffffc0 >> 0x20),
                      (int)in_stack_ffffffffffffffc0,
                      (int64_t *)CONCAT44(uVar3,in_stack_ffffffffffffffb8));
  ggml_set_name(pgVar1,"a");
  uVar5 = *(undefined4 *)&in_RDI[1]._vptr_test_case;
  uVar4 = in_RSI;
  std::array<long,_4UL>::data((array<long,_4UL> *)0x150da2);
  pgVar2 = test_case::ggml_new_tensor
                     (in_RDI,(ggml_context *)CONCAT44(uVar5,in_stack_ffffffffffffffc8),
                      (ggml_type)((ulong)uVar4 >> 0x20),(int)uVar4,
                      (int64_t *)CONCAT44(uVar3,in_stack_ffffffffffffffb8));
  ggml_set_name(pgVar2,"b");
  pgVar1 = (ggml_tensor *)
           ggml_rms_norm_back(*(undefined4 *)
                               &in_RDI[1].sentinels.
                                super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>.
                                _M_impl.super__Vector_impl_data._M_finish,in_RSI,pgVar1,pgVar2);
  ggml_set_name(pgVar1,"out");
  return pgVar1;
}

Assistant:

ggml_tensor * build_graph(ggml_context * ctx) override {
        ggml_tensor * a = ggml_new_tensor(ctx, type, 4, ne.data());
        ggml_set_name(a, "a");

        ggml_tensor * b = ggml_new_tensor(ctx, type, 4, ne.data());
        ggml_set_name(b, "b");

        ggml_tensor * out = ggml_rms_norm_back(ctx, a, b, eps);
        ggml_set_name(out, "out");

        return out;
    }